

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamLogger.cpp
# Opt level: O1

StreamLogger * liblogger::GetStreamLogger(void)

{
  int iVar1;
  StreamLogger *this;
  
  iVar1 = pthread_once(&GetStreamLogger::once,MakeKey);
  if (iVar1 == 0) {
    this = (StreamLogger *)pthread_getspecific(key);
    if (this == (StreamLogger *)0x0) {
      this = (StreamLogger *)operator_new(400);
      StreamLogger::StreamLogger(this);
      pthread_setspecific(key,this);
    }
    return this;
  }
  abort();
}

Assistant:

StreamLogger &GetStreamLogger()
{
	static pthread_once_t once = PTHREAD_ONCE_INIT;
	if (pthread_once(&once, MakeKey) != 0)
		abort();
	
	StreamLogger *p = (StreamLogger *) pthread_getspecific(key);
	if (!p) {
		p = new StreamLogger();
		pthread_setspecific(key, p);
	}
	return *p;
}